

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O0

vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
* hwtest::pgraph::pgraph_debug_regs
            (vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
             *__return_storage_ptr__,chipset_info *chipset)

{
  pointer pRVar1;
  SimpleMmioRegister *pSVar2;
  uint32_t uVar3;
  allocator local_679;
  string local_678 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_658;
  undefined1 local_64a;
  allocator local_649;
  string local_648 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_628;
  undefined1 local_61a;
  allocator local_619;
  string local_618 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_5f8;
  undefined1 local_5ea;
  allocator local_5e9;
  string local_5e8 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_5c8;
  undefined1 local_5ba;
  allocator local_5b9;
  string local_5b8 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_598;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_590;
  undefined1 local_582;
  allocator local_581;
  string local_580 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_560;
  undefined1 local_552;
  allocator local_551;
  string local_550 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_530;
  undefined1 local_522;
  allocator local_521;
  string local_520 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_500;
  undefined1 local_4f2;
  allocator local_4f1;
  string local_4f0 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_4d0;
  undefined1 local_4c2;
  allocator local_4c1;
  string local_4c0 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_4a0;
  undefined1 local_492;
  allocator local_491;
  string local_490 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_470;
  undefined1 local_462;
  allocator local_461;
  string local_460 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_440;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_438;
  undefined1 local_42a;
  allocator local_429;
  string local_428 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_408;
  undefined1 local_3fa;
  allocator local_3f9;
  string local_3f8 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_3d8;
  undefined1 local_3ca;
  allocator local_3c9;
  string local_3c8 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_3a8;
  undefined1 local_39a;
  allocator local_399;
  string local_398 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_378;
  undefined1 local_36a;
  allocator local_369;
  string local_368 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_348;
  undefined1 local_33a;
  allocator local_339;
  string local_338 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_318;
  undefined1 local_30a;
  allocator local_309;
  string local_308 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_2e8;
  undefined1 local_2da;
  allocator local_2d9;
  string local_2d8 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_2b8;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_2b0;
  byte local_2a3;
  undefined1 local_2a2;
  allocator local_2a1;
  string local_2a0 [5];
  bool is_nv25p;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_280;
  undefined1 local_272;
  allocator local_271;
  string local_270 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_250;
  undefined1 local_242;
  allocator local_241;
  string local_240 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_220;
  undefined1 local_212;
  allocator local_211;
  string local_210 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_1f0;
  undefined1 local_1e2;
  allocator local_1e1;
  string local_1e0 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_1c0;
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_190;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_188;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_180;
  byte local_175;
  byte local_174;
  byte local_173;
  undefined1 local_172;
  allocator local_171;
  string local_170 [3];
  bool is_nv17p;
  bool is_nv15p;
  bool is_nv11p;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_150;
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_120;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_118;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_110;
  byte local_103;
  undefined1 local_102;
  allocator local_101;
  string local_100 [5];
  bool is_nv5;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_e0;
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_b0;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_a8;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_a0;
  undefined1 local_92;
  allocator local_91;
  string local_90 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_70;
  undefined1 local_62;
  allocator local_61;
  string local_60 [32];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_40 [3];
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> local_28;
  undefined1 local_19;
  chipset_info *local_18;
  chipset_info *chipset_local;
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  *res;
  
  local_19 = 0;
  local_18 = chipset;
  chipset_local = (chipset_info *)__return_storage_ptr__;
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  ::vector(__return_storage_ptr__);
  if (local_18->card_type == 1) {
    pRVar1 = (pointer)operator_new(0x40);
    Nv1DebugARegister::Nv1DebugARegister((Nv1DebugARegister *)pRVar1,0x400080,0x11111110);
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_28,pRVar1);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_28);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_28);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_62 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"DEBUG_B",&local_61);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x400084,0x31111101,(string *)local_60,0x24,0);
    local_62 = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )local_40,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_40);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(local_40);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_92 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"DEBUG_C",&local_91);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x400088,0x11111111,(string *)local_90,0x28,0);
    local_92 = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_70,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_70);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_70);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  else if (local_18->card_type == 3) {
    pRVar1 = (pointer)operator_new(0x40);
    Nv1DebugARegister::Nv1DebugARegister((Nv1DebugARegister *)pRVar1,0x400080,0x13311110);
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_a0,pRVar1);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_a0);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_a0);
    pRVar1 = (pointer)operator_new(0x40);
    DebugBRegister::DebugBRegister((DebugBRegister *)pRVar1,0x400084,0x10113301);
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_a8,pRVar1);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_a8);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_a8);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_d2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"DEBUG_C",&local_d1);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x400088,0x1133f111,(string *)local_d0,0x28,0);
    local_d2 = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_b0,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_b0);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_b0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_102 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"DEBUG_D",&local_101);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x40008c,0x1173ff31,(string *)local_100,0x2c,0);
    local_102 = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_e0,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_e0);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_e0);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  else if (local_18->card_type == 4) {
    local_103 = 4 < local_18->chipset;
    pRVar1 = (pointer)operator_new(0x40);
    Nv4DebugARegister::Nv4DebugARegister((Nv4DebugARegister *)pRVar1,0x400080,0x1337f000);
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_110,pRVar1);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_110);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_110);
    pRVar1 = (pointer)operator_new(0x40);
    uVar3 = 0x72113101;
    if ((local_103 & 1) != 0) {
      uVar3 = 0xf2ffb701;
    }
    DebugBRegister::DebugBRegister((DebugBRegister *)pRVar1,0x400084,uVar3);
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_118,pRVar1);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_118);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_118);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_142 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"DEBUG_C",&local_141);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x400088,0x11d7fff1,(string *)local_140,0x28,0);
    local_142 = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_120,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_120);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_120);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_172 = 1;
    uVar3 = 0x11ffff33;
    if ((local_103 & 1) != 0) {
      uVar3 = 0xfbffff73;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_170,"DEBUG_D",&local_171);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x40008c,uVar3,(string *)local_170,0x2c,0);
    local_172 = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_150,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_150);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_150);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
  }
  else if (local_18->card_type == 0x10) {
    local_173 = nv04_pgraph_is_nv11p(local_18);
    local_174 = nv04_pgraph_is_nv15p(local_18);
    local_175 = nv04_pgraph_is_nv17p(local_18);
    if ((local_173 & 1) == 0) {
      pRVar1 = (pointer)operator_new(0x40);
      CelsiusDebugBRegister::DebugBRegister((CelsiusDebugBRegister *)pRVar1,0x400084,0xfe11f701);
      std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
      unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
                ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>
                  *)&local_180,pRVar1);
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_180);
      std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
      ~unique_ptr(&local_180);
    }
    else {
      pRVar1 = (pointer)operator_new(0x40);
      CelsiusDebugBRegister::DebugBRegister((CelsiusDebugBRegister *)pRVar1,0x400084,0xfe71f701);
      std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
      unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
                ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>
                  *)&local_188,pRVar1);
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_188);
      std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
      ~unique_ptr(&local_188);
    }
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_1b2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"DEBUG_C",&local_1b1);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x400088,0xffffffff,(string *)local_1b0,0x28,0);
    local_1b2 = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_190,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_190);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_190);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    if ((local_174 & 1) == 0) {
      pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
      local_1e2 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e0,"DEBUG_D",&local_1e1);
      SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x40008c,0xfffffc70,(string *)local_1e0,0x2c,0);
      local_1e2 = 0;
      std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
      unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
                ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>
                  *)&local_1c0,(pointer)pSVar2);
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_1c0);
      std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
      ~unique_ptr(&local_1c0);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    }
    else if ((local_175 & 1) == 0) {
      pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
      local_212 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"DEBUG_D",&local_211);
      SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x40008c,0xffffff78,(string *)local_210,0x2c,0);
      local_212 = 0;
      std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
      unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
                ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>
                  *)&local_1f0,(pointer)pSVar2);
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_1f0);
      std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
      ~unique_ptr(&local_1f0);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
    }
    else {
      pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
      local_242 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_240,"DEBUG_D",&local_241);
      SimpleMmioRegister::SimpleMmioRegister
                (pSVar2,0x40008c,0xffffff78,(string *)local_240,0x2c,0x400);
      local_242 = 0;
      std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
      unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
                ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>
                  *)&local_220,(pointer)pSVar2);
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_220);
      std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
      ~unique_ptr(&local_220);
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator((allocator<char> *)&local_241);
    }
    if ((local_175 & 1) == 0) {
      pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
      local_272 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_270,"DEBUG_E",&local_271);
      SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x400090,0xffffff,(string *)local_270,0x30,0);
      local_272 = 0;
      std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
      unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
                ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>
                  *)&local_250,(pointer)pSVar2);
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_250);
      std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
      ~unique_ptr(&local_250);
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
    }
    else {
      pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
      local_2a2 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a0,"DEBUG_E",&local_2a1);
      SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x400090,0x1fffffff,(string *)local_2a0,0x30,0);
      local_2a2 = 0;
      std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
      unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
                ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>
                  *)&local_280,(pointer)pSVar2);
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_280);
      std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
      ~unique_ptr(&local_280);
      std::__cxx11::string::~string(local_2a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    }
  }
  else if (local_18->card_type == 0x20) {
    local_2a3 = ::nv04_pgraph_is_nv25p(local_18);
    pRVar1 = (pointer)operator_new(0x40);
    DebugBRegister::DebugBRegister((DebugBRegister *)pRVar1,0x400084,0x11f7c1);
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_2b0,pRVar1);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_2b0);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_2b0);
    if ((local_2a3 & 1) == 0) {
      pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
      local_2da = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d8,"DEBUG_D",&local_2d9);
      SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x40008c,0xffffd77d,(string *)local_2d8,0x2c,0);
      local_2da = 0;
      std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
      unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
                ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>
                  *)&local_2b8,(pointer)pSVar2);
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_2b8);
      std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
      ~unique_ptr(&local_2b8);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
      local_30a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_308,"DEBUG_E",&local_309);
      SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x400090,0xfffff3ff,(string *)local_308,0x30,0);
      local_30a = 0;
      std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
      unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
                ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>
                  *)&local_2e8,(pointer)pSVar2);
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_2e8);
      std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
      ~unique_ptr(&local_2e8);
      std::__cxx11::string::~string(local_308);
      std::allocator<char>::~allocator((allocator<char> *)&local_309);
      pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
      local_33a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_338,"DEBUG_F",&local_339);
      SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x400094,0xff,(string *)local_338,0x34,0);
      local_33a = 0;
      std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
      unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
                ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>
                  *)&local_318,(pointer)pSVar2);
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_318);
      std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
      ~unique_ptr(&local_318);
      std::__cxx11::string::~string(local_338);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
    }
    else {
      pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
      local_36a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_368,"DEBUG_D",&local_369);
      SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x40008c,0xffffdf7d,(string *)local_368,0x2c,0);
      local_36a = 0;
      std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
      unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
                ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>
                  *)&local_348,(pointer)pSVar2);
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_348);
      std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
      ~unique_ptr(&local_348);
      std::__cxx11::string::~string(local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
      pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
      local_39a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_398,"DEBUG_E",&local_399);
      SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x400090,0xffffffff,(string *)local_398,0x30,0);
      local_39a = 0;
      std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
      unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
                ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>
                  *)&local_378,(pointer)pSVar2);
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_378);
      std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
      ~unique_ptr(&local_378);
      std::__cxx11::string::~string(local_398);
      std::allocator<char>::~allocator((allocator<char> *)&local_399);
    }
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_3ca = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c8,"DEBUG_G",&local_3c9);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x400098,0xffffffff,(string *)local_3c8,0x38,0);
    local_3ca = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_3a8,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_3a8);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_3a8);
    std::__cxx11::string::~string(local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_3fa = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f8,"DEBUG_FD_CHECK_SKIP",&local_3f9);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x40009c,0xfff,(string *)local_3f8,0x40,0);
    local_3fa = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_3d8,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_3d8);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_3d8);
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    if ((local_2a3 & 1) != 0) {
      pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
      local_42a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_428,"DEBUG_L",&local_429);
      SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x4000c0,3,(string *)local_428,0x50,0);
      local_42a = 0;
      std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
      unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
                ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>
                  *)&local_408,(pointer)pSVar2);
      std::
      vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_408);
      std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
      ~unique_ptr(&local_408);
      std::__cxx11::string::~string(local_428);
      std::allocator<char>::~allocator((allocator<char> *)&local_429);
    }
  }
  else if (local_18->card_type == 0x30) {
    pRVar1 = (pointer)operator_new(0x40);
    DebugBRegister::DebugBRegister((DebugBRegister *)pRVar1,0x400084,0x7012f7c1);
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_438,pRVar1);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_438);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_438);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_462 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_460,"DEBUG_D",&local_461);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x40008c,0xfffedf7d,(string *)local_460,0x2c,0);
    local_462 = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_440,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_440);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_440);
    std::__cxx11::string::~string(local_460);
    std::allocator<char>::~allocator((allocator<char> *)&local_461);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_492 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_490,"DEBUG_E",&local_491);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x400090,0x3fffffff,(string *)local_490,0x30,0);
    local_492 = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_470,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_470);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_470);
    std::__cxx11::string::~string(local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_4c2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c0,"DEBUG_G",&local_4c1);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x400098,0xffffffff,(string *)local_4c0,0x38,0);
    local_4c2 = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_4a0,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_4a0);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_4a0);
    std::__cxx11::string::~string(local_4c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_4f2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f0,"DEBUG_H",&local_4f1);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x40009c,0xffffffff,(string *)local_4f0,0x3c,0);
    local_4f2 = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_4d0,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_4d0);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_4d0);
    std::__cxx11::string::~string(local_4f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_522 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_520,"DEBUG_I",&local_521);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x4000a0,0xffffffff,(string *)local_520,0x44,0);
    local_522 = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_500,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_500);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_500);
    std::__cxx11::string::~string(local_520);
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_552 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,"DEBUG_J",&local_551);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x4000a4,0xf,(string *)local_550,0x48,0);
    local_552 = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_530,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_530);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_530);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_582 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_580,"DEBUG_L",&local_581);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x4000c0,0x1e,(string *)local_580,0x50,0);
    local_582 = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_560,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_560);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_560);
    std::__cxx11::string::~string(local_580);
    std::allocator<char>::~allocator((allocator<char> *)&local_581);
  }
  else {
    pRVar1 = (pointer)operator_new(0x40);
    DebugBRegister::DebugBRegister((DebugBRegister *)pRVar1,0x400084,0x7010c7c1);
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_590,pRVar1);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_590);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_590);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_5ba = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5b8,"DEBUG_D",&local_5b9);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x40008c,0xe1fad155,(string *)local_5b8,0x2c,0);
    local_5ba = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_598,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_598);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_598);
    std::__cxx11::string::~string(local_5b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_5ea = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e8,"DEBUG_E",&local_5e9);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x400090,0x33ffffff,(string *)local_5e8,0x30,0);
    local_5ea = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_5c8,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_5c8);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_5c8);
    std::__cxx11::string::~string(local_5e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_61a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_618,"DEBUG_J",&local_619);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x4000a4,0xf,(string *)local_618,0x48,0);
    local_61a = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_5f8,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_5f8);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_5f8);
    std::__cxx11::string::~string(local_618);
    std::allocator<char>::~allocator((allocator<char> *)&local_619);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    local_64a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_648,"DEBUG_K",&local_649);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x4000b0,0x3f,(string *)local_648,0x4c,0);
    local_64a = 0;
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_628,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_628);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_628);
    std::__cxx11::string::~string(local_648);
    std::allocator<char>::~allocator((allocator<char> *)&local_649);
    pSVar2 = (SimpleMmioRegister *)operator_new(0x40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_678,"DEBUG_L",&local_679);
    SimpleMmioRegister::SimpleMmioRegister(pSVar2,0x4000c0,6,(string *)local_678,0x50,0);
    std::unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>>::
    unique_ptr<std::default_delete<hwtest::pgraph::Register>,void>
              ((unique_ptr<hwtest::pgraph::Register,std::default_delete<hwtest::pgraph::Register>> *
               )&local_658,(pointer)pSVar2);
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_658);
    std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
    ~unique_ptr(&local_658);
    std::__cxx11::string::~string(local_678);
    std::allocator<char>::~allocator((allocator<char> *)&local_679);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<Register>> pgraph_debug_regs(const chipset_info &chipset) {
	std::vector<std::unique_ptr<Register>> res;
	if (chipset.card_type == 1) {
		AREG(Nv1DebugARegister, 0x400080, 0x11111110);
		REG(0x400084, 0x31111101, "DEBUG_B", debug_b);
		REG(0x400088, 0x11111111, "DEBUG_C", debug_c);
	} else if (chipset.card_type == 3) {
		AREG(Nv1DebugARegister, 0x400080, 0x13311110);
		AREG(DebugBRegister, 0x400084, 0x10113301);
		REG(0x400088, 0x1133f111, "DEBUG_C", debug_c);
		REG(0x40008c, 0x1173ff31, "DEBUG_D", debug_d);
	} else if (chipset.card_type == 4) {
		bool is_nv5 = chipset.chipset >= 5;
		AREG(Nv4DebugARegister, 0x400080, 0x1337f000);
		AREG(DebugBRegister, 0x400084, (is_nv5 ? 0xf2ffb701 : 0x72113101));
		REG(0x400088, 0x11d7fff1, "DEBUG_C", debug_c);
		REG(0x40008c, (is_nv5 ? 0xfbffff73 : 0x11ffff33), "DEBUG_D", debug_d);
	} else if (chipset.card_type == 0x10) {
		bool is_nv11p = nv04_pgraph_is_nv11p(&chipset);
		bool is_nv15p = nv04_pgraph_is_nv15p(&chipset);
		bool is_nv17p = nv04_pgraph_is_nv17p(&chipset);
		// XXX DEBUG_A
		if (!is_nv11p) {
			AREG(CelsiusDebugBRegister, 0x400084, 0xfe11f701);
		} else {
			AREG(CelsiusDebugBRegister, 0x400084, 0xfe71f701);
		}
		REG(0x400088, 0xffffffff, "DEBUG_C", debug_c);
		if (!is_nv15p) {
			REG(0x40008c, 0xfffffc70, "DEBUG_D", debug_d);
		} else if (!is_nv17p) {
			REG(0x40008c, 0xffffff78, "DEBUG_D", debug_d);
		} else {
			REGF(0x40008c, 0xffffff78, "DEBUG_D", debug_d, 0x400);
		}
		if (!is_nv17p) {
			REG(0x400090, 0x00ffffff, "DEBUG_E", debug_e);
		} else {
			REG(0x400090, 0x1fffffff, "DEBUG_E", debug_e);
		}
	} else if (chipset.card_type == 0x20) {
		bool is_nv25p = nv04_pgraph_is_nv25p(&chipset);
		// XXX DEBUG_A
		AREG(DebugBRegister, 0x400084, 0x0011f7c1);
		if (!is_nv25p) {
			REG(0x40008c, 0xffffd77d, "DEBUG_D", debug_d);
			REG(0x400090, 0xfffff3ff, "DEBUG_E", debug_e);
			REG(0x400094, 0x000000ff, "DEBUG_F", debug_f);
		} else {
			REG(0x40008c, 0xffffdf7d, "DEBUG_D", debug_d);
			REG(0x400090, 0xffffffff, "DEBUG_E", debug_e);
		}
		REG(0x400098, 0xffffffff, "DEBUG_G", debug_g);
		REG(0x40009c, 0x00000fff, "DEBUG_FD_CHECK_SKIP", debug_fd_check_skip);
		if (is_nv25p) {
			REG(0x4000c0, 0x00000003, "DEBUG_L", debug_l);
		}
	} else if (chipset.card_type == 0x30) {
		// XXX DEBUG_A
		AREG(DebugBRegister, 0x400084, 0x7012f7c1);
		REG(0x40008c, 0xfffedf7d, "DEBUG_D", debug_d);
		REG(0x400090, 0x3fffffff, "DEBUG_E", debug_e);
		REG(0x400098, 0xffffffff, "DEBUG_G", debug_g);
		REG(0x40009c, 0xffffffff, "DEBUG_H", debug_h);
		REG(0x4000a0, 0xffffffff, "DEBUG_I", debug_i);
		REG(0x4000a4, 0x0000000f, "DEBUG_J", debug_j);
		REG(0x4000c0, 0x0000001e, "DEBUG_L", debug_l);
	} else {
		// XXX DEBUG_A
		AREG(DebugBRegister, 0x400084, 0x7010c7c1);
		REG(0x40008c, 0xe1fad155, "DEBUG_D", debug_d);
		REG(0x400090, 0x33ffffff, "DEBUG_E", debug_e);
		REG(0x4000a4, 0x0000000f, "DEBUG_J", debug_j);
		REG(0x4000b0, 0x0000003f, "DEBUG_K", debug_k);
		REG(0x4000c0, 0x00000006, "DEBUG_L", debug_l);
	}
	return res;
}